

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBGInterface.cpp
# Opt level: O0

int handlesbginterface(RS232PORT *pSBGInterfacePseudoRS232Port)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int offset;
  int len;
  uchar payload [256];
  uint8 sendbuf [8192];
  int local_cc;
  uchar local_c8 [4];
  int sendbuflen;
  uFloat_SBG delta_angle_z;
  uFloat_SBG delta_angle_y;
  uFloat_SBG delta_angle_x;
  uFloat_SBG delta_vel_z;
  uFloat_SBG delta_vel_y;
  uFloat_SBG delta_vel_x;
  uFloat_SBG temp;
  uFloat_SBG gyrz;
  uFloat_SBG gyry;
  uFloat_SBG gyrx;
  uFloat_SBG accz;
  uFloat_SBG accy;
  uFloat_SBG accx;
  uFloat_SBG yaw_acc;
  uFloat_SBG pitch_acc;
  uFloat_SBG roll_acc;
  double qz;
  double qy;
  double qx;
  double qw;
  float local_60;
  uFloat_SBG q3;
  uFloat_SBG q2;
  uFloat_SBG q1;
  uFloat_SBG q0;
  uFloat_SBG yaw;
  uFloat_SBG pitch;
  uFloat_SBG roll;
  undefined4 uStack_40;
  uShort_SBG imu_status;
  uInt_SBG solution_status;
  uInt_SBG time_stamp;
  uShort_SBG errorCode;
  uchar classId;
  uchar cmdId;
  uInt_SBG transferOffset;
  uInt_SBG transferSize;
  undefined2 uStack_28;
  uShort_SBG transferCmd;
  uchar calDay;
  uchar calMonth;
  uShort_SBG calYear;
  uInt_SBG calRev;
  uInt_SBG fwRev;
  uInt_SBG hwRev;
  uInt_SBG serial;
  RS232PORT *pSBGInterfacePseudoRS232Port_local;
  
  transferSize.c[1] = '\0';
  transferSize.c[0] = '\0';
  solution_status.c[3] = '\0';
  solution_status.c[2] = '\0';
  qx = 0.0;
  qy = 0.0;
  qz = 0.0;
  _pitch_acc = 0.0;
  local_cc = 0;
  _hwRev = pSBGInterfacePseudoRS232Port;
  EnterCriticalSection(&StateVariablesCS);
  uStack_40 = 0;
  dVar2 = Center((interval *)&phihat);
  dVar2 = fmod_2PI(dVar2);
  yaw.v = (float)dVar2;
  dVar2 = Center((interval *)&thetahat);
  dVar2 = fmod_2PI(-dVar2);
  q0.v = (float)dVar2;
  dVar2 = -angle_env;
  dVar3 = Center((interval *)&psihat);
  dVar2 = fmod_2PI((dVar2 - dVar3) + 1.5707963267948966);
  q1.v = (float)dVar2;
  euler2quaternion((double)yaw.v,(double)q0.v,(double)q1.v,&qx,&qy,&qz,(double *)&pitch_acc.v);
  q2.v = (float)qx;
  q3.v = (float)qy;
  local_60 = (float)qz;
  qw._4_4_ = (float)_pitch_acc;
  yaw_acc.v = 0.0;
  accx.v = 0.0;
  accy.v = 0.0;
  roll.v = 2.8026e-45;
  pitch._2_2_ = 0xffff;
  dVar2 = Center((interval *)&accrxhat);
  accz.v = (float)dVar2;
  dVar2 = Center((interval *)&accryhat);
  gyrx.v = (float)-dVar2;
  dVar2 = Center((interval *)&accrzhat);
  gyry.v = (float)-dVar2;
  dVar2 = Center((interval *)&omegaxhat);
  gyrz.v = (float)dVar2;
  dVar2 = Center((interval *)&omegayhat);
  temp.v = (float)-dVar2;
  dVar2 = Center((interval *)&omegazhat);
  delta_vel_x.v = (float)-dVar2;
  delta_vel_y.v = 0.0;
  delta_vel_z.v = 0.0;
  delta_angle_x.v = 0.0;
  delta_angle_y.v = 0.0;
  delta_angle_z.v = 0.0;
  sendbuflen = 0;
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  LeaveCriticalSection(&StateVariablesCS);
  fwRev.v = 45000000;
  transferSize.v._2_2_ = 0x7e3;
  transferSize.c[1] = '\x04';
  transferSize.c[0] = '\x16';
  _uStack_28 = CONCAT13(1,CONCAT12(1,uStack_28));
  calRev.c[2] = 1;
  calRev.c[3] = 1;
  _calDay = CONCAT13(1,CONCAT12(6,_calDay));
  memset(&offset,0,0x100);
  strcpy((char *)&offset,"ELLIPSE2-A-G4A3-B1");
  payload._24_2_ = (undefined2)fwRev.v;
  payload._26_2_ = (undefined2)(fwRev.v >> 0x10);
  payload._28_2_ = (undefined2)_uStack_28;
  payload._30_2_ = (undefined2)((uint)_uStack_28 >> 0x10);
  payload[0x20] = transferSize._2_1_;
  payload[0x21] = transferSize._3_1_;
  payload[0x22] = transferSize.c[1];
  payload[0x23] = transferSize.c[0];
  payload._36_2_ = (undefined2)calRev.v;
  payload._38_2_ = (undefined2)(calRev.v >> 0x10);
  payload._40_2_ = (undefined2)_calDay;
  payload._42_2_ = (undefined2)((uint)_calDay >> 0x10);
  EncodeFrameSBG(payload + 0xf8,&local_cc,'\x04','\x10',(uchar *)&offset,0x3a);
  iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
  if (iVar1 == 0) {
    solution_status.c[3] = '\x03';
    solution_status.c[2] = '\x10';
    solution_status.v._0_2_ = 0;
    offset._0_1_ = 3;
    offset._2_1_ = 0x10;
    len._0_2_ = 0;
    EncodeFrameSBG(payload + 0xf8,&local_cc,'\0','\x10',(uchar *)&offset,6);
    iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
    if (iVar1 == 0) {
      transferOffset.v._2_2_ = 0;
      _errorCode = 0;
      offset._0_1_ = 0;
      offset._1_1_ = 0;
      offset._2_1_ = 0;
      offset._3_1_ = 0;
      len._0_2_ = 0;
      EncodeFrameSBG(payload + 0xf8,&local_cc,'\x03','\x10',(uchar *)&offset,6);
      iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
      if (iVar1 == 0) {
        solution_status.c[3] = '\x03';
        solution_status.c[2] = '\x10';
        solution_status.v._0_2_ = 0;
        offset._0_1_ = 3;
        offset._2_1_ = 0x10;
        len._0_2_ = 0;
        EncodeFrameSBG(payload + 0xf8,&local_cc,'\0','\x10',(uchar *)&offset,6);
        iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
        if (iVar1 == 0) {
          transferOffset.v._2_2_ = 1;
          time_stamp.v = 0;
          offset._0_1_ = 1;
          offset._1_1_ = 0;
          offset._2_1_ = 0;
          offset._3_1_ = 0;
          len._0_2_ = 0;
          EncodeFrameSBG(payload + 0xf8,&local_cc,'\x03','\x10',(uchar *)&offset,6);
          iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
          if (iVar1 == 0) {
            solution_status.c[3] = '\x03';
            solution_status.c[2] = '\x10';
            solution_status.v._0_2_ = 0;
            offset._0_1_ = 3;
            offset._2_1_ = 0x10;
            len._0_2_ = 0;
            EncodeFrameSBG(payload + 0xf8,&local_cc,'\0','\x10',(uchar *)&offset,6);
            iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
            if (iVar1 == 0) {
              transferOffset.v._2_2_ = 2;
              offset._0_1_ = 2;
              offset._1_1_ = 0;
              EncodeFrameSBG(payload + 0xf8,&local_cc,'\x03','\x10',(uchar *)&offset,2);
              iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
              if (iVar1 == 0) {
                solution_status.c[3] = '\x03';
                solution_status.c[2] = '\x10';
                solution_status.v._0_2_ = 0;
                offset._0_1_ = 3;
                offset._2_1_ = 0x10;
                len._0_2_ = 0;
                EncodeFrameSBG(payload + 0xf8,&local_cc,'\0','\x10',(uchar *)&offset,6);
                iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
                if (iVar1 == 0) {
                  offset._0_1_ = (undefined1)uStack_40;
                  offset._1_1_ = (undefined1)((uint)uStack_40 >> 8);
                  offset._2_1_ = (undefined1)((uint)uStack_40 >> 0x10);
                  offset._3_1_ = (undefined1)((uint)uStack_40 >> 0x18);
                  len._0_2_ = yaw._0_2_;
                  len._2_2_ = yaw._2_2_;
                  payload._0_2_ = q0._0_2_;
                  payload._2_2_ = q0._2_2_;
                  payload._4_2_ = q1._0_2_;
                  payload._6_2_ = q1._2_2_;
                  payload._8_2_ = yaw_acc._0_2_;
                  payload._10_2_ = yaw_acc._2_2_;
                  payload._12_2_ = accx._0_2_;
                  payload._14_2_ = accx._2_2_;
                  payload._16_2_ = accy._0_2_;
                  payload._18_2_ = accy._2_2_;
                  payload._20_2_ = roll._0_2_;
                  payload._22_2_ = roll._2_2_;
                  EncodeFrameSBG(payload + 0xf8,&local_cc,'\x06','\0',(uchar *)&offset,0x20);
                  iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
                  if (iVar1 == 0) {
                    offset._0_1_ = (undefined1)uStack_40;
                    offset._1_1_ = (undefined1)((uint)uStack_40 >> 8);
                    offset._2_1_ = (undefined1)((uint)uStack_40 >> 0x10);
                    offset._3_1_ = (undefined1)((uint)uStack_40 >> 0x18);
                    len._0_2_ = q2._0_2_;
                    len._2_2_ = q2._2_2_;
                    payload._0_2_ = q3._0_2_;
                    payload._2_2_ = q3._2_2_;
                    payload._4_2_ = SUB42(local_60,0);
                    payload._6_2_ = (undefined2)((uint)local_60 >> 0x10);
                    payload._8_2_ = SUB42(qw._4_4_,0);
                    payload._10_2_ = (undefined2)((uint)qw._4_4_ >> 0x10);
                    payload._12_2_ = yaw_acc._0_2_;
                    payload._14_2_ = yaw_acc._2_2_;
                    payload._16_2_ = accx._0_2_;
                    payload._18_2_ = accx._2_2_;
                    payload._20_2_ = accy._0_2_;
                    payload._22_2_ = accy._2_2_;
                    payload._24_2_ = roll._0_2_;
                    payload._26_2_ = roll._2_2_;
                    EncodeFrameSBG(payload + 0xf8,&local_cc,'\a','\0',(uchar *)&offset,0x24);
                    iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
                    if (iVar1 == 0) {
                      offset._0_1_ = (undefined1)uStack_40;
                      offset._1_1_ = (undefined1)((uint)uStack_40 >> 8);
                      offset._2_1_ = (undefined1)((uint)uStack_40 >> 0x10);
                      offset._3_1_ = (undefined1)((uint)uStack_40 >> 0x18);
                      len._0_2_ = pitch._2_2_;
                      len._2_2_ = accz._0_2_;
                      payload._0_2_ = accz._2_2_;
                      payload._2_2_ = gyrx._0_2_;
                      payload._4_2_ = gyrx._2_2_;
                      payload._6_2_ = gyry._0_2_;
                      payload._8_2_ = gyry._2_2_;
                      payload._10_2_ = gyrz._0_2_;
                      payload._12_2_ = gyrz._2_2_;
                      payload._14_2_ = temp._0_2_;
                      payload._16_2_ = temp._2_2_;
                      payload._18_2_ = delta_vel_x._0_2_;
                      payload._20_2_ = delta_vel_x._2_2_;
                      payload._22_2_ = delta_vel_y._0_2_;
                      payload._24_2_ = delta_vel_y._2_2_;
                      payload._26_2_ = delta_vel_z._0_2_;
                      payload._28_2_ = delta_vel_z._2_2_;
                      payload._30_2_ = delta_angle_x._0_2_;
                      payload._32_2_ = delta_angle_x._2_2_;
                      payload[0x22] = delta_angle_y.c[0];
                      payload[0x23] = delta_angle_y.c[1];
                      payload._36_2_ = delta_angle_y._2_2_;
                      payload._38_2_ = delta_angle_z._0_2_;
                      payload._40_2_ = delta_angle_z._2_2_;
                      payload._42_2_ = (undefined2)sendbuflen;
                      payload._44_2_ = (undefined2)((uint)sendbuflen >> 0x10);
                      payload[0x2e] = local_c8[0];
                      payload[0x2f] = local_c8[1];
                      payload[0x30] = local_c8[2];
                      payload[0x31] = local_c8[3];
                      EncodeFrameSBG(payload + 0xf8,&local_cc,'\x03','\0',(uchar *)&offset,0x3a);
                      iVar1 = WriteAllRS232Port(_hwRev,payload + 0xf8,local_cc);
                      if (iVar1 == 0) {
                        uSleep(20000);
                        pSBGInterfacePseudoRS232Port_local._4_4_ = 0;
                      }
                      else {
                        pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
                      }
                    }
                    else {
                      pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
                    }
                  }
                  else {
                    pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
                  }
                }
                else {
                  pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
                }
              }
              else {
                pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
              }
            }
            else {
              pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
            }
          }
          else {
            pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
          }
        }
        else {
          pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
        }
      }
      else {
        pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
      }
    }
    else {
      pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
    }
  }
  else {
    pSBGInterfacePseudoRS232Port_local._4_4_ = 1;
  }
  return pSBGInterfacePseudoRS232Port_local._4_4_;
}

Assistant:

int handlesbginterface(RS232PORT* pSBGInterfacePseudoRS232Port)
{
	uInt_SBG serial, hwRev, fwRev, calRev;
	uShort_SBG calYear;
	unsigned char calMonth = 0, calDay = 0;
	uShort_SBG transferCmd;
	uInt_SBG transferSize, transferOffset;
	unsigned char cmdId = 0, classId = 0;
	uShort_SBG errorCode;
	uInt_SBG time_stamp, solution_status;
	uShort_SBG imu_status;
	uFloat_SBG roll, pitch, yaw;
	uFloat_SBG q0, q1, q2, q3;
	double qw = 0, qx = 0, qy = 0, qz = 0;
	uFloat_SBG roll_acc, pitch_acc, yaw_acc;
	uFloat_SBG accx, accy, accz, gyrx, gyry, gyrz, temp, delta_vel_x, delta_vel_y, delta_vel_z, delta_angle_x, delta_angle_y, delta_angle_z;
	int sendbuflen = 0;
	uint8 sendbuf[MAX_NB_BYTES_SBG];
	unsigned char payload[256];
	int len = 0;
	int offset = 0;

	EnterCriticalSection(&StateVariablesCS);

	time_stamp.v = 0;
	roll.v = (float)fmod_2PI(Center(phihat));
	pitch.v = (float)fmod_2PI(-Center(thetahat));
	yaw.v = (float)fmod_2PI(-angle_env-Center(psihat)+M_PI/2.0);
	euler2quaternion((double)roll.v, (double)pitch.v, (double)yaw.v, &qw, &qx, &qy, &qz);
	q0.v = (float)qw; q1.v = (float)qx; q2.v = (float)qy; q3.v = (float)qz;
	roll_acc.v = 0;
	pitch_acc.v = 0;
	yaw_acc.v = 0;
	solution_status.v = SBG_ECOM_SOL_MODE_AHRS;

	imu_status.v = (unsigned short)0xFFFF;
	accx.v = (float)Center(accrxhat);
	accy.v = (float)-Center(accryhat);
	accz.v = (float)-Center(accrzhat);
	gyrx.v = (float)Center(omegaxhat);
	gyry.v = (float)-Center(omegayhat);
	gyrz.v = (float)-Center(omegazhat);
	temp.v = 0;
	delta_vel_x.v = 0;
	delta_vel_y.v = 0;
	delta_vel_z.v = 0;
	delta_angle_x.v = 0;
	delta_angle_y.v = 0;
	delta_angle_z.v = 0;

	LeaveCriticalSection(&StateVariablesCS);

	serial.v = 45000000;
	calYear.v = 2019; calMonth = 4, calDay = 22;
	calRev.c[3] = 1; calRev.c[2] = 1;
	hwRev.c[3] = 1; hwRev.c[2] = 1;
	fwRev.c[3] = 1; fwRev.c[2] = 6;

	memset(payload, 0, sizeof(payload));
	strcpy((char*)payload, "ELLIPSE2-A-G4A3-B1");
	offset = 32;
	memcpy(payload+offset, serial.c, 4);
	offset += 4;
	memcpy(payload+offset, calRev.c, 4);
	offset += 4;
	memcpy(payload+offset, calYear.c, 2);
	offset += 2;
	memcpy(payload+offset, &calMonth, 1);
	offset += 1;
	memcpy(payload+offset, &calDay, 1);
	offset += 1;
	memcpy(payload+offset, hwRev.c, 4);
	offset += 4;
	memcpy(payload+offset, fwRev.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 58;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_INFO, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	transferCmd.v = 0x0000;
	transferSize.v = 0;

	offset = 0;
	memcpy(payload+offset, transferCmd.c, 2);
	offset += 2;
	memcpy(payload+offset, transferSize.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_EXPORT_SETTINGS, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	transferCmd.v = 0x0001;
	transferOffset.v = 0;

	offset = 0;
	memcpy(payload+offset, transferCmd.c, 2);
	offset += 2;
	memcpy(payload+offset, transferOffset.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_EXPORT_SETTINGS, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	transferCmd.v = 0x0002;

	offset = 0;
	memcpy(payload+offset, transferCmd.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_EXPORT_SETTINGS, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	cmdId = SBG_ECOM_CMD_EXPORT_SETTINGS; classId = SBG_ECOM_CLASS_LOG_CMD_0;
	errorCode.v = 0;

	offset = 0;
	memcpy(payload+offset, &cmdId, 1);
	offset += 2;
	memcpy(payload+offset, &classId, 1);
	offset += 2;
	memcpy(payload+offset, errorCode.c, 2);
	offset += 2;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = offset;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_CMD_ACK, SBG_ECOM_CLASS_LOG_CMD_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	offset = 0;
	memcpy(payload+offset, time_stamp.c, 4);
	offset += 4;
	memcpy(payload+offset, roll.c, 4);
	offset += 4;
	memcpy(payload+offset, pitch.c, 4);
	offset += 4;
	memcpy(payload+offset, yaw.c, 4);
	offset += 4;
	memcpy(payload+offset, roll_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, pitch_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, yaw_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, solution_status.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 32;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_LOG_EKF_EULER, SBG_ECOM_CLASS_LOG_ECOM_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	offset = 0;
	memcpy(payload+offset, time_stamp.c, 4);
	offset += 4;
	memcpy(payload+offset, q0.c, 4);
	offset += 4;
	memcpy(payload+offset, q1.c, 4);
	offset += 4;
	memcpy(payload+offset, q2.c, 4);
	offset += 4;
	memcpy(payload+offset, q3.c, 4);
	offset += 4;
	memcpy(payload+offset, roll_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, pitch_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, yaw_acc.c, 4);
	offset += 4;
	memcpy(payload+offset, solution_status.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 36;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_LOG_EKF_QUAT, SBG_ECOM_CLASS_LOG_ECOM_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	offset = 0;
	memcpy(payload+offset, time_stamp.c, 4);
	offset += 4;
	memcpy(payload+offset, imu_status.c, 2);
	offset += 2;
	memcpy(payload+offset, accx.c, 4);
	offset += 4;
	memcpy(payload+offset, accy.c, 4);
	offset += 4;
	memcpy(payload+offset, accz.c, 4);
	offset += 4;
	memcpy(payload+offset, gyrx.c, 4);
	offset += 4;
	memcpy(payload+offset, gyry.c, 4);
	offset += 4;
	memcpy(payload+offset, gyrz.c, 4);
	offset += 4;
	memcpy(payload+offset, temp.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_vel_x.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_vel_y.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_vel_z.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_angle_x.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_angle_y.c, 4);
	offset += 4;
	memcpy(payload+offset, delta_angle_z.c, 4);
	offset += 4;
	//memset(sendbuf, 0, sizeof(sendbuf));
	len = 58;
	EncodeFrameSBG(sendbuf, &sendbuflen, SBG_ECOM_LOG_IMU_DATA, SBG_ECOM_CLASS_LOG_ECOM_0, payload, len);
	if (WriteAllRS232Port(pSBGInterfacePseudoRS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	uSleep(1000*20);

	return EXIT_SUCCESS;
}